

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pragma_once(CTcTokenizer *this)

{
  CTcTokFileDesc *this_00;
  CTcTokenizer *in_RDI;
  CTcTokenizer *unaff_retaddr;
  CTcTokenizer *fname;
  
  fname = in_RDI;
  this_00 = CTcTokStream::get_desc(in_RDI->str_);
  CTcTokFileDesc::get_fname(this_00);
  add_include_once(unaff_retaddr,(char *)fname);
  clear_linebuf(in_RDI);
  return;
}

Assistant:

void CTcTokenizer::pragma_once()
{
    /* add this file to the ONCE list */
    add_include_once(str_->get_desc()->get_fname());

    /* don't retain this pragma in the result */
    clear_linebuf();
}